

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

void reconstruct(uint8_t *buf,uint64_t sz)

{
  int d;
  uint8_t *stop;
  uint8_t *t;
  uint64_t sz_local;
  uint8_t *buf_local;
  
  for (t = buf + 1; t < buf + sz; t = t + 1) {
    *t = t[-1] + *t + 0x80;
  }
  return;
}

Assistant:

static void
reconstruct (uint8_t* buf, uint64_t sz)
{
    uint8_t* t    = buf + 1;
    uint8_t* stop = buf + sz;
    while (t < stop)
    {
        int d = (int) (t[-1]) + (int) (t[0]) - 128;
        t[0]  = (uint8_t) d;
        ++t;
    }
}